

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-wizard.c
# Opt level: O1

void do_cmd_wiz_create_all_obj(command *cmd)

{
  object_kind *poVar1;
  _Bool _Var2;
  object *in_RAX;
  ulong uVar3;
  long lVar4;
  
  if (z_info->k_max != 0) {
    lVar4 = 0;
    uVar3 = 0;
    do {
      poVar1 = k_info;
      if ((*(long **)(k_info->flags + lVar4 + -0x70) != (long *)0x0) &&
         (**(long **)(k_info->flags + lVar4 + -0x70) != 0)) {
        _Var2 = flag_has_dbg(k_info->kind_flags + lVar4,2,4,"kind->kind_flags","KF_INSTA_ART");
        if (!_Var2) {
          wiz_create_object_from_kind((object_kind *)(poVar1->flags + lVar4 + -0x80));
          wiz_drop_object(in_RAX);
        }
      }
      uVar3 = uVar3 + 1;
      lVar4 = lVar4 + 0x2a0;
    } while (uVar3 < z_info->k_max);
  }
  return;
}

Assistant:

void do_cmd_wiz_create_all_obj(struct command *cmd)
{
	int i;

	for (i = 0; i < z_info->k_max; i++) {
		struct object_kind *kind = &k_info[i];
		struct object *obj;

		if (kind->base == NULL || kind->base->name == NULL) continue;
		if (kf_has(kind->kind_flags, KF_INSTA_ART)) continue;

		obj = wiz_create_object_from_kind(kind);
		wiz_drop_object(obj);
	}
}